

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

bool Diligent::LinuxFileSystem::CreateDirectory(Char *strPath)

{
  bool bVar1;
  int iVar2;
  Char *pCVar3;
  char *__path;
  int *piVar4;
  string local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subPath;
  size_t position;
  undefined1 local_68 [8];
  string path;
  undefined1 local_38 [8];
  string msg;
  Char *strPath_local;
  
  msg.field_2._8_8_ = strPath;
  if ((strPath == (Char *)0x0) || (*strPath == '\0')) {
    FormatString<char[31]>((string *)local_38,(char (*) [31])"Path must not be null or empty");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CreateDirectory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Linux/src/LinuxFileSystem.cpp"
               ,0x58);
    std::__cxx11::string::~string((string *)local_38);
    strPath_local._7_1_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_68,strPath,(allocator *)((long)&position + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&position + 7));
    BasicFileSystem::CorrectSlashes((String *)local_68,'\0');
    subPath.field_2._8_8_ = 0;
    do {
      if (subPath.field_2._8_8_ == -1) {
        strPath_local._7_1_ = 1;
        break;
      }
      subPath.field_2._8_8_ = std::__cxx11::string::find((char)local_68,0x2f);
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_68);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      bVar1 = PathExists(pCVar3);
      if (bVar1) {
LAB_00418c64:
        bVar1 = false;
      }
      else {
        __path = (char *)std::__cxx11::string::c_str();
        iVar2 = mkdir(__path,0x1ff);
        if ((iVar2 == 0) || (piVar4 = __errno_location(), *piVar4 == 0x11)) goto LAB_00418c64;
        strPath_local._7_1_ = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string(local_98);
    } while (!bVar1);
    std::__cxx11::string::~string((string *)local_68);
  }
  return (bool)(strPath_local._7_1_ & 1);
}

Assistant:

bool LinuxFileSystem::CreateDirectory(const Char* strPath)
{
    if (strPath == nullptr || strPath[0] == '\0')
    {
        UNEXPECTED("Path must not be null or empty");
        return false;
    }

    std::string path = strPath;
    CorrectSlashes(path);

    size_t position = 0;
    while (position != std::string::npos)
    {
        position     = path.find(SlashSymbol, position + 1);
        auto subPath = path.substr(0, position);
        if (!PathExists(subPath.c_str()))
        {
            if (mkdir(subPath.c_str(), S_IRWXU | S_IRWXG | S_IRWXO) != 0)
            {
                // If multiple threads are trying to create the same directory, it is possible
                // that the directory has been created by another thread, which is OK.
                if (errno != EEXIST)
                    return false;
            }
        }
    }
    return true;
}